

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.h
# Opt level: O0

double __thiscall pbrt::SummedAreaTable::lookup(SummedAreaTable *this,int x,int y)

{
  int iVar1;
  int iVar2;
  int x_00;
  int iVar3;
  double *pdVar4;
  int in_EDX;
  int in_ESI;
  Array2D<double> *in_RDI;
  double local_8;
  
  if ((in_ESI == 0) || (in_EDX == 0)) {
    local_8 = 0.0;
  }
  else {
    iVar1 = in_ESI + -1;
    iVar2 = Array2D<double>::xSize(in_RDI);
    iVar2 = iVar2 + -1;
    std::min<int>((int *)&stack0xffffffffffffffe4,(int *)&stack0xffffffffffffffe0);
    x_00 = in_EDX + -1;
    iVar3 = Array2D<double>::ySize(in_RDI);
    iVar3 = iVar3 + -1;
    std::min<int>((int *)&stack0xffffffffffffffdc,(int *)&stack0xffffffffffffffd8);
    pdVar4 = Array2D<double>::operator()((Array2D<double> *)CONCAT44(iVar1,iVar2),x_00,iVar3);
    local_8 = *pdVar4;
  }
  return local_8;
}

Assistant:

PBRT_CPU_GPU
    double lookup(int x, int y) const {
        // Return zero at lower boundaries
        if (x == 0 || y == 0)
            return 0;

        // Reindex $(x,y)$ and return actual stored value
        x = std::min(x - 1, sum.xSize() - 1);
        y = std::min(y - 1, sum.ySize() - 1);
        return sum(x, y);
    }